

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui.cpp
# Opt level: O0

float ImGui::CalcItemWidth(void)

{
  ImGuiWindow *pIVar1;
  ImVec2 IVar2;
  float local_20;
  float local_14;
  float width_to_right_edge;
  float w;
  ImGuiWindow *window;
  
  pIVar1 = GetCurrentWindowRead();
  local_14 = (pIVar1->DC).ItemWidth;
  if (local_14 < 0.0) {
    IVar2 = GetContentRegionAvail();
    local_20 = IVar2.x;
    local_14 = ImMax<float>(1.0,local_20 + local_14);
  }
  return (float)(int)local_14;
}

Assistant:

float ImGui::CalcItemWidth()
{
    ImGuiWindow* window = GetCurrentWindowRead();
    float w = window->DC.ItemWidth;
    if (w < 0.0f)
    {
        // Align to a right-side limit. We include 1 frame padding in the calculation because this is how the width is always used (we add 2 frame padding to it), but we could move that responsibility to the widget as well.
        float width_to_right_edge = GetContentRegionAvail().x;
        w = ImMax(1.0f, width_to_right_edge + w);
    }
    w = (float)(int)w;
    return w;
}